

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp_image.cpp
# Opt level: O2

void Bitmap_Operation::Save
               (string *path,Image *image,uint32_t startX,uint32_t startY,uint32_t width,
               uint32_t height)

{
  byte bVar1;
  ulong uVar2;
  imageException *piVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uchar *puVar7;
  bool bVar8;
  allocator_type local_2e2;
  value_type_conflict1 local_2e1;
  string *local_2e0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pallete;
  vector<unsigned_char,_std::allocator<unsigned_char>_> temp;
  BitmapInfoHeader local_278;
  fstream file;
  char local_230 [16];
  byte abStack_220 [496];
  
  local_2e0 = path;
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (image,startX,startY,width,height);
  pallete.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pallete.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pallete.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar1 = image->_colorCount;
  if (bVar1 == 1) {
    generateGrayScalePallete();
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign(&pallete,&file);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&file);
    bVar1 = image->_colorCount;
    iVar6 = ((int)pallete.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (int)pallete.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start) + 0x36;
  }
  else {
    iVar6 = 0x36;
  }
  local_278.super_BitmapDibHeader._vptr_BitmapDibHeader =
       (_func_int **)&PTR__BitmapDibHeader_0011fbf8;
  uVar5 = bVar1 * width + 3 & 0xfffffffc;
  local_278.biSize = 0x28;
  local_278.biPlanes = 1;
  local_278.biClrUsed = 0;
  local_278.biClrImportant = 0;
  uVar4 = uVar5 * height;
  local_278.biXPelsPerMeter = 0;
  local_278.biYPelsPerMeter = 0;
  local_278.biBitCount = (ushort)bVar1 * 8;
  local_278._24_8_ = (ulong)uVar4 << 0x20;
  local_278.biWidth = width;
  local_278.biHeight = height;
  local_278.overallSize = local_278.biSize;
  std::fstream::fstream(&file);
  std::fstream::open((string *)&file,(_Ios_Openmode)local_2e0);
  if ((abStack_220[*(long *)(_file + -0x18)] & 5) != 0) {
    piVar3 = (imageException *)__cxa_allocate_exception(0x28);
    imageException::imageException(piVar3,"Cannot create file for saving");
    __cxa_throw(piVar3,&imageException::typeinfo,imageException::~imageException);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&data,0x14,(allocator_type *)&temp);
  local_2e0 = (string *)CONCAT44(local_2e0._4_4_,width);
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0] = 'B';
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 'M';
  *(uint *)(data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start + 2) = uVar4 + iVar6;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[6] = '\0';
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[7] = '\0';
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[8] = '\0';
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[9] = '\0';
  *(int *)(data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start + 10) = iVar6;
  std::ostream::write(local_230,
                      (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&data,0x38);
  BitmapInfoHeader::get(&local_278,&data);
  std::ostream::write(local_230,
                      (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
  if (pallete.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start !=
      pallete.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::ostream::write(local_230,
                        (long)pallete.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
  }
  std::ostream::flush();
  uVar4 = image->_rowSize;
  puVar7 = image->_data;
  local_2e1 = '\0';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&temp,(ulong)uVar5,&local_2e1,&local_2e2);
  uVar2 = (ulong)local_2e0 & 0xffffffff;
  puVar7 = puVar7 + (ulong)(startX * bVar1) + (ulong)(((startY - 1) + height) * uVar4);
  while (bVar8 = height != 0, height = height - 1, bVar8) {
    memcpy(temp.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start,puVar7,bVar1 * uVar2);
    std::ostream::write(local_230,
                        (long)temp.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                              ._M_impl.super__Vector_impl_data._M_start);
    std::ostream::flush();
    puVar7 = puVar7 + -(ulong)uVar4;
  }
  if ((abStack_220[*(long *)(_file + -0x18)] & 5) == 0) {
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&temp.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    std::fstream::~fstream(&file);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&pallete.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    return;
  }
  piVar3 = (imageException *)__cxa_allocate_exception(0x28);
  imageException::imageException(piVar3,"failed to write data into file");
  __cxa_throw(piVar3,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void Save( const std::string & path, const PenguinV_Image::Image & image, uint32_t startX, uint32_t startY,
               uint32_t width, uint32_t height )
    {
        Image_Function::ParameterValidation( image, startX, startY, width, height );

        uint32_t palleteSize = 0;
        std::vector < uint8_t > pallete;

        // Create a pallete only for gray-scale image
        if( image.colorCount() == 1u ) {
            pallete = generateGrayScalePallete();
            palleteSize = static_cast<uint32_t>( pallete.size() );
        }

        const uint8_t colorCount = image.colorCount();

        uint32_t lineLength = width * colorCount;
        if( lineLength % BITMAP_ALIGNMENT != 0 )
            lineLength = (lineLength / BITMAP_ALIGNMENT + 1) * BITMAP_ALIGNMENT;

        BitmapFileHeader header;
        BitmapInfoHeader info;

        header.bfSize    = header.overallSize + info.size() + palleteSize + lineLength * height;
        header.bfOffBits = header.overallSize + info.size() + palleteSize;

        info.setWidth     ( width );
        info.setHeight    ( height );
        info.setColorCount( colorCount );
        info.setImageSize ( lineLength * height );

        std::fstream file;
        file.open( path, std::fstream::out | std::fstream::trunc | std::fstream::binary );

        if( !file )
            throw imageException( "Cannot create file for saving" );

        std::vector < uint8_t > data( sizeof( BitmapFileHeader ) );

        header.get( data );
        file.write( reinterpret_cast<const char *>(data.data()), header.overallSize );

        data.resize( sizeof( BitmapInfoHeader ) );

        info.get( data );
        file.write( reinterpret_cast<const char *>(data.data()), info.size() );

        if( !pallete.empty() )
            file.write( reinterpret_cast<const char *>(pallete.data()), static_cast<std::streamsize>(pallete.size()) );

        file.flush();

        const uint32_t rowSize = image.rowSize();

        const uint8_t * imageY = image.data() + (startY + height - 1) * rowSize + startX * colorCount;

        std::vector < uint8_t > temp( lineLength, 0 );

        for( uint32_t rowId = 0; rowId < height; ++rowId, imageY -= rowSize ) {
            memcpy( temp.data(), imageY, sizeof( uint8_t ) * width * colorCount );

            file.write( reinterpret_cast<const char *>(temp.data()), lineLength );
            file.flush();
        }

        if( !file )
            throw imageException( "failed to write data into file" );
    }